

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O1

void init_stop(stop_t *record)

{
  record->id[0] = '\0';
  record->code[0] = '\0';
  record->name[0] = '\0';
  record->desc[0] = '\0';
  record->lat = (longdouble)0;
  record->lon = (longdouble)0;
  record->zone_id[0] = '\0';
  record->url[0] = '\0';
  record->location_type = LT_STOP;
  record->parent_station[0] = '\0';
  record->timezone[0] = '\0';
  record->wheelchair_boarding = WB_UNKNOWN_OR_INHERITED;
  record->level_id[0] = '\0';
  record->platform_code[0] = '\0';
  return;
}

Assistant:

void init_stop(stop_t *record){
    strcpy(record->id, "");
    strcpy(record->code, "");
    strcpy(record->name, "");
    strcpy(record->desc, "");
    record->lat = 0.0;
    record->lon = 0.0;
    strcpy(record->zone_id, "");
    strcpy(record->url, "");
    record->location_type = LT_STOP;
    strcpy(record->parent_station, "");
    strcpy(record->timezone, "");
    record->wheelchair_boarding = WB_UNKNOWN_OR_INHERITED;
    strcpy(record->level_id, "");
    strcpy(record->platform_code, "");
}